

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::StringGetcMethod::StringGetcMethod(StringGetcMethod *this,Builtins *builtins)

{
  initializer_list<const_slang::ast::Type_*> __l;
  Type *this_00;
  long in_RSI;
  undefined8 *in_RDI;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *this_01;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  Type *in_stack_ffffffffffffffb0;
  allocator_type *in_stack_ffffffffffffffb8;
  iterator ppTVar1;
  SimpleSystemSubroutine *this_02;
  
  this_00 = (Type *)(in_RSI + 0x210);
  ppTVar1 = (iterator)&stack0xffffffffffffffc0;
  this_02 = (SimpleSystemSubroutine *)0x1;
  this_01 = (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
            &stack0xffffffffffffffbf;
  std::allocator<const_slang::ast::Type_*>::allocator
            ((allocator<const_slang::ast::Type_*> *)0xb3a57a);
  __l._M_len = (size_type)this_02;
  __l._M_array = ppTVar1;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)this_00,
             __l,in_stack_ffffffffffffffb8);
  SimpleSystemSubroutine::SimpleSystemSubroutine
            (this_02,(KnownSystemName)((ulong)ppTVar1 >> 0x20),(SubroutineKind)ppTVar1,
             (size_t)this_00,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,(bool)in_stack_ffffffffffffffaf,
             (bool)in_stack_ffffffffffffffae);
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector(this_01)
  ;
  std::allocator<const_slang::ast::Type_*>::~allocator
            ((allocator<const_slang::ast::Type_*> *)&stack0xffffffffffffffbf);
  *in_RDI = &PTR__StringGetcMethod_01011ff8;
  return;
}

Assistant:

explicit StringGetcMethod(const Builtins& builtins) :
        SimpleSystemSubroutine(KnownSystemName::Getc, SubroutineKind::Function, 1,
                               {&builtins.intType}, builtins.byteType, true) {}